

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sectionstyle.cpp
# Opt level: O3

void __thiscall ON_SectionStyle::Dump(ON_SectionStyle *this,ON_TextLog *dump)

{
  ON_SectionStylePrivate *pOVar1;
  ON_Color *pOVar2;
  char *pcVar3;
  anon_union_4_2_6147a14e_for_ON_Color_15 local_2c;
  
  ON_ModelComponent::Dump(&this->super_ON_ModelComponent,dump);
  pOVar1 = this->m_private;
  if (pOVar1 == (ON_SectionStylePrivate *)0x0) {
    pOVar1 = &DefaultSectionStylePrivate;
  }
  if ((ulong)pOVar1->m_background_fill_mode < 3) {
    ON_TextLog::Print(dump,&DAT_006cc278 +
                           *(int *)(&DAT_006cc278 + (ulong)pOVar1->m_background_fill_mode * 4));
  }
  pOVar1 = this->m_private;
  if (pOVar1 == (ON_SectionStylePrivate *)0x0) {
    pOVar1 = &DefaultSectionStylePrivate;
  }
  pcVar3 = "Boundary not visible\n";
  if (pOVar1->m_boundary_visible != false) {
    pcVar3 = "Boundary visible\n";
  }
  ON_TextLog::Print(dump,pcVar3);
  pOVar1 = this->m_private;
  if (pOVar1 == (ON_SectionStylePrivate *)0x0) {
    pOVar1 = &DefaultSectionStylePrivate;
  }
  ON_TextLog::Print(dump,"Boundary width scale = %g\n",pOVar1->m_boundary_width_scale);
  pOVar1 = this->m_private;
  if (pOVar1 == (ON_SectionStylePrivate *)0x0) {
    pOVar1 = &DefaultSectionStylePrivate;
  }
  if (pOVar1->m_fill_rule == ClosedCurves) {
    pcVar3 = "Fill when section makes closed curves\n";
  }
  else {
    if (pOVar1->m_fill_rule != SolidObjects) goto LAB_005abbc9;
    pcVar3 = "Fill only with solid objects\n";
  }
  ON_TextLog::Print(dump,pcVar3);
LAB_005abbc9:
  pOVar1 = this->m_private;
  if (pOVar1 == (ON_SectionStylePrivate *)0x0) {
    pOVar1 = &DefaultSectionStylePrivate;
  }
  ON_TextLog::Print(dump,"Hatch index = %d\n",(ulong)(uint)pOVar1->m_hatch_index);
  pOVar1 = this->m_private;
  if (pOVar1 == (ON_SectionStylePrivate *)0x0) {
    pOVar1 = &DefaultSectionStylePrivate;
  }
  ON_TextLog::Print(dump,"Hatch scale = %g\n",pOVar1->m_hatch_scale);
  pOVar1 = this->m_private;
  if (pOVar1 == (ON_SectionStylePrivate *)0x0) {
    pOVar1 = &DefaultSectionStylePrivate;
  }
  ON_TextLog::Print(dump,"Hatch rotation = %g\n",pOVar1->m_hatch_rotation);
  ON_TextLog::Print(dump,"Boundary color");
  pOVar2 = &this->m_private->m_boundary_color;
  if (this->m_private == (ON_SectionStylePrivate *)0x0) {
    pOVar2 = &ON_Color::UnsetColor;
  }
  local_2c = pOVar2->field_0;
  ON_TextLog::PrintColor(dump,(ON_Color *)&local_2c);
  ON_TextLog::Print(dump,"\n");
  ON_TextLog::Print(dump,"Boundary print color");
  pOVar2 = &this->m_private->m_boundary_print_color;
  if (this->m_private == (ON_SectionStylePrivate *)0x0) {
    pOVar2 = &ON_Color::UnsetColor;
  }
  local_2c = pOVar2->field_0;
  ON_TextLog::PrintColor(dump,(ON_Color *)&local_2c);
  ON_TextLog::Print(dump,"\n");
  ON_TextLog::Print(dump,"Background fill color");
  pOVar2 = &this->m_private->m_background_fill_color;
  if (this->m_private == (ON_SectionStylePrivate *)0x0) {
    pOVar2 = &ON_Color::UnsetColor;
  }
  local_2c = pOVar2->field_0;
  ON_TextLog::PrintColor(dump,(ON_Color *)&local_2c);
  ON_TextLog::Print(dump,"\n");
  ON_TextLog::Print(dump,"Background fill print color");
  pOVar2 = &this->m_private->m_background_fill_print_color;
  if (this->m_private == (ON_SectionStylePrivate *)0x0) {
    pOVar2 = &ON_Color::UnsetColor;
  }
  local_2c = pOVar2->field_0;
  ON_TextLog::PrintColor(dump,(ON_Color *)&local_2c);
  ON_TextLog::Print(dump,"\n");
  ON_TextLog::Print(dump,"Hatch color");
  pOVar2 = &this->m_private->m_hatch_color;
  if (this->m_private == (ON_SectionStylePrivate *)0x0) {
    pOVar2 = &ON_Color::UnsetColor;
  }
  local_2c = pOVar2->field_0;
  ON_TextLog::PrintColor(dump,(ON_Color *)&local_2c);
  ON_TextLog::Print(dump,"\n");
  ON_TextLog::Print(dump,"Hatch print color");
  pOVar2 = &this->m_private->m_hatch_print_color;
  if (this->m_private == (ON_SectionStylePrivate *)0x0) {
    pOVar2 = &ON_Color::UnsetColor;
  }
  local_2c = pOVar2->field_0;
  ON_TextLog::PrintColor(dump,(ON_Color *)&local_2c);
  ON_TextLog::Print(dump,"\n");
  return;
}

Assistant:

void ON_SectionStyle::Dump( ON_TextLog& dump ) const
{
  ON_ModelComponent::Dump(dump);

  switch (BackgroundFillMode())
  {
  case ON_SectionStyle::SectionBackgroundFillMode::None:
    dump.Print("No background fill\n");
    break;
  case ON_SectionStyle::SectionBackgroundFillMode::Viewport:
    dump.Print("Viewport background fill\n");
    break;
  case ON_SectionStyle::SectionBackgroundFillMode::SolidColor:
    dump.Print("Solid color background fill\n");
    break;
  }

  if (BoundaryVisible())
    dump.Print("Boundary visible\n");
  else
    dump.Print("Boundary not visible\n");

  dump.Print("Boundary width scale = %g\n", BoundaryWidthScale());
  switch (SectionFillRule())
  {
  case ON::SectionFillRule::ClosedCurves:
    dump.Print("Fill when section makes closed curves\n");
    break;
  case ON::SectionFillRule::SolidObjects:
    dump.Print("Fill only with solid objects\n");
    break;
  }

  dump.Print("Hatch index = %d\n", HatchIndex());
  dump.Print("Hatch scale = %g\n", HatchScale());
  dump.Print("Hatch rotation = %g\n", HatchRotation());

  dump.Print("Boundary color");
  dump.PrintColor(BoundaryColor(false));
  dump.Print("\n");
  dump.Print("Boundary print color");
  dump.PrintColor(BoundaryColor(true));
  dump.Print("\n");
  dump.Print("Background fill color");
  dump.PrintColor(BackgroundFillColor(false));
  dump.Print("\n");
  dump.Print("Background fill print color");
  dump.PrintColor(BackgroundFillColor(true));
  dump.Print("\n");
  dump.Print("Hatch color");
  dump.PrintColor(HatchColor(false));
  dump.Print("\n");
  dump.Print("Hatch print color");
  dump.PrintColor(HatchColor(true));
  dump.Print("\n");
}